

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_int>
          (RecyclableObject *pObj,uint len,uint start,uint deleteLen,Var *insertArgs,
          uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  JavascriptArray *object;
  bool bVar1;
  BOOL BVar2;
  JavascriptArray *pJVar3;
  JavascriptCopyOnAccessNativeIntArray *this;
  Var pvVar4;
  undefined4 in_register_0000000c;
  uint uVar5;
  uint32 index;
  ScriptContext *pSVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 index_00;
  uint uVar9;
  BigIndex index_01;
  BigIndex idxDest;
  BigIndex local_a8;
  Var *local_98;
  JavascriptArray *local_90;
  JavascriptArray *local_88;
  undefined1 local_80 [8];
  BigIndex k;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  jsReentLock._28_4_ = in_register_0000000c;
  jsReentLock._24_4_ = deleteLen;
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_98 = insertArgs;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_int>
                        (pObj,jsReentLock._24_4_,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    *(bool *)((long)local_60 + 0x108) = true;
    if (((JavascriptArray *)pNewObj == (JavascriptArray *)0x0) &&
       (pNewObj = (RecyclableObject *)
                  JavascriptLibrary::CreateArray
                            ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                             jsReentLock._24_4_),
       (((JavascriptArray *)pNewObj)->head).ptr == EmptySegment)) {
      AllocateHead<void*>((JavascriptArray *)pNewObj);
    }
  }
  bVar1 = IsNonES5Array(pNewObj);
  if (bVar1) {
    pJVar3 = UnsafeVarTo<Js::JavascriptArray>(pNewObj);
  }
  else {
    pJVar3 = (JavascriptArray *)0x0;
  }
  local_90 = pJVar3;
  local_88 = (JavascriptArray *)pNewObj;
  k.bigIndex = (ulong)insertLen;
  if (pJVar3 == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)local_80,0);
    if (jsReentLock._24_4_ != 0) {
      uVar7 = jsReentLock._24_8_ & 0xffffffff;
      uVar5 = start;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar2 = JavascriptOperators::HasItem(pObj,uVar5);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar2 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar4 = JavascriptOperators::GetItem(pObj,uVar5,scriptContext);
          idxDest.bigIndex = (uint64)pvVar4;
          idxDest.index = k.index;
          idxDest._4_4_ = k._4_4_;
          uVar9 = SetArrayLikeObjects(local_88,(RecyclableObject *)(ulong)(uint)local_80._0_4_,
                                      idxDest,insertArgs);
          index_01.bigIndex = (uint64)insertArgs;
          index_01.index = k.index;
          index_01._4_4_ = k._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar9,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)(uint)local_80._0_4_,index_01);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
        if (local_80._0_4_ == 0xffffffff) {
          k._0_8_ = k._0_8_ + 1;
        }
        else {
          local_80._0_4_ = local_80._0_4_ + 1;
        }
        uVar5 = uVar5 + 1;
        uVar9 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
  }
  else {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar3);
    if (bVar1) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar3);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,pJVar3);
    if (jsReentLock._24_4_ != 0) {
      uVar5 = 0;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar2 = JavascriptOperators::HasItem(pObj,start + uVar5);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar2 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar4 = JavascriptOperators::GetItem(pObj,start + uVar5,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,(ulong)uVar5,pvVar4,0);
        }
        uVar5 = uVar5 + 1;
      } while (jsReentLock._24_4_ != uVar5);
    }
  }
  uVar5 = (uint)k.bigIndex;
  if ((uint)jsReentLock._24_4_ < uVar5) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex((BigIndex *)local_80,uVar5 + start);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
              (pObj,(BigIndex *)local_80,jsReentLock._24_4_ + start,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
  }
  else if (uVar5 < (uint)jsReentLock._24_4_) {
    index = jsReentLock._24_4_ + start;
    if (index < len) {
      index_00 = uVar5 + start;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar2 = JavascriptOperators::HasItem(pObj,index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (BVar2 == 0) {
          BVar2 = JavascriptOperators::DeleteItem
                            (pObj,index_00,PropertyOperation_ThrowOnDeleteIfNotConfig);
          if (BVar2 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        }
        else {
          pvVar4 = JavascriptOperators::GetItem(pObj,index,scriptContext);
          BVar2 = JavascriptOperators::SetItem
                            (pObj,pObj,index_00,pvVar4,scriptContext,
                             PropertyOperation_ThrowIfNotExtensible,0);
          if (BVar2 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        }
        *(bool *)((long)local_60 + 0x108) = true;
        index = index + 1;
        index_00 = index_00 + 1;
      } while (index < len);
    }
    uVar5 = (len - jsReentLock._24_4_) + (int)k.bigIndex;
    if (uVar5 < len) {
      uVar9 = len;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar9 = uVar9 - 1;
        BVar2 = JavascriptOperators::DeleteItem
                          (pObj,uVar9,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
      } while (uVar5 < uVar9);
    }
  }
  if ((int)k.bigIndex != 0) {
    uVar8 = k.bigIndex & 0xffffffff;
    uVar7 = 0;
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BigIndex::BigIndex((BigIndex *)local_80,(int)uVar7 + start);
      BVar2 = BigIndex::SetItem((BigIndex *)local_80,pObj,local_98[uVar7],
                                PropertyOperation_ThrowIfNotExtensible);
      if (BVar2 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  uVar5 = (len - jsReentLock._24_4_) + (int)k.bigIndex;
  pSVar6 = (ScriptContext *)(ulong)uVar5;
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex((BigIndex *)local_80,uVar5);
  pvVar4 = BigIndex::ToNumber((BigIndex *)local_80,pSVar6);
  BVar2 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar4,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  object = local_88;
  pJVar3 = local_90;
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  pSVar6 = (ScriptContext *)jsReentLock._24_8_;
  BigIndex::BigIndex(&local_a8,jsReentLock._24_4_);
  pvVar4 = BigIndex::ToNumber(&local_a8,pSVar6);
  BVar2 = JavascriptOperators::SetProperty
                    (object,(RecyclableObject *)object,0xd1,pvVar4,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if (pJVar3 != (JavascriptArray *)0x0) {
    (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar3);
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)object;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }